

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O0

int nn_xpull_recv(nn_sockbase *self,nn_msg *msg)

{
  nn_msg *in_RSI;
  nn_fq *in_RDI;
  int rc;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  local_24 = nn_fq_recv(in_RDI,in_RSI,
                        (nn_pipe **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (-1 < local_24) {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static int nn_xpull_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;

    rc = nn_fq_recv (&nn_cont (self, struct nn_xpull, sockbase)->fq,
         msg, NULL);

    /*  Discard NN_PIPEBASE_PARSED flag. */
    return rc < 0 ? rc : 0;
}